

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O3

void __thiscall luna::GC::MinorGCSweep(GC *this)

{
  uint *puVar1;
  byte bVar2;
  uint local_2c;
  GCObject *local_28;
  
  local_28 = (this->gen0_).gen_;
  if (local_28 != (GCObject *)0x0) {
    do {
      (this->gen0_).gen_ = local_28->next_;
      bVar2 = local_28->field_0x10;
      if ((bVar2 & 0xc) == 4) {
        local_28->field_0x10 = (bVar2 & 0xf0) + 1;
        local_28->next_ = (this->gen1_).gen_;
        (this->gen1_).gen_ = local_28;
        puVar1 = &(this->gen1_).count_;
        *puVar1 = *puVar1 + 1;
      }
      else {
        local_2c = (uint)(bVar2 >> 4);
        if ((this->obj_deleter_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->obj_deleter_)._M_invoker)((_Any_data *)&this->obj_deleter_,&local_28,&local_2c);
      }
      local_28 = (this->gen0_).gen_;
    } while (local_28 != (GCObject *)0x0);
  }
  (this->gen0_).count_ = 0;
  return;
}

Assistant:

void GC::MinorGCSweep()
    {
        // Sweep GCGen0
        while (gen0_.gen_)
        {
            GCObject *obj = gen0_.gen_;
            gen0_.gen_ = gen0_.gen_->next_;

            // Move object to GCGen1 generation when object is black
            if (obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                obj->generation_ = GCGen1;
                obj->next_ = gen1_.gen_;
                gen1_.gen_ = obj;
                gen1_.count_++;
            }
            else
            {
                obj_deleter_(obj, obj->gc_obj_type_);
            }
        }

        gen0_.count_ = 0;
    }